

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall soul::heart::Printer::PrinterStream::printStateVariables(PrinterStream *this)

{
  Role RVar1;
  pool_ref<soul::heart::Variable> *ppVar2;
  pointer ppVar3;
  CodePrinter *pCVar4;
  string *name;
  Expression *e;
  pointer ppVar5;
  char *s;
  Variable *pVVar6;
  pointer type;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> variables;
  VariableListByType list;
  string local_50;
  
  ppVar2 = (this->module->stateVariables).stateVariables.items;
  variables.e = ppVar2 + (this->module->stateVariables).stateVariables.numActive;
  variables.s = ppVar2;
  Utilities::VariableListByType::VariableListByType(&list,variables);
  for (type = list.types.
              super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
              ._M_impl.super__Vector_impl_data._M_start;
      type != list.types.
              super__Vector_base<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
              ._M_impl.super__Vector_impl_data._M_finish; type = type + 1) {
    ppVar3 = (type->variables).
             super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar5 = (type->variables).
                  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar3; ppVar5 = ppVar5 + 1)
    {
      RVar1 = ppVar5->object->role;
      s = "let ";
      if (RVar1 != constant) {
        s = "var ";
      }
      if (RVar1 == external) {
        s = "let external ";
      }
      pCVar4 = choc::text::CodePrinter::operator<<(this->out,s);
      getTypeDescription_abi_cxx11_(&local_50,this,&type->type);
      pCVar4 = choc::text::CodePrinter::operator<<(pCVar4,&local_50);
      choc::text::CodePrinter::operator<<(pCVar4,' ');
      std::__cxx11::string::~string((string *)&local_50);
      name = Identifier::operator_cast_to_string_(&ppVar5->object->name);
      printVarWithPrefix(this,name);
      pVVar6 = ppVar5->object;
      if ((pVVar6->initialValue).object != (Expression *)0x0) {
        choc::text::CodePrinter::operator<<(this->out," = ");
        e = pool_ptr<soul::heart::Expression>::operator*(&ppVar5->object->initialValue);
        printExpression(this,e);
        pVVar6 = ppVar5->object;
      }
      printDescription(this,&pVVar6->annotation);
      pCVar4 = choc::text::CodePrinter::operator<<(this->out,';');
      choc::text::CodePrinter::startNewLine(pCVar4);
    }
  }
  std::
  vector<soul::heart::Utilities::VariableListByType::VariablesWithType,_std::allocator<soul::heart::Utilities::VariableListByType::VariablesWithType>_>
  ::~vector(&list.types);
  return;
}

Assistant:

void printStateVariables()
        {
            heart::Utilities::VariableListByType list (module.stateVariables.get());

            for (auto& type : list.types)
            {
                for (auto& v : type.variables)
                {
                    out << (v->isExternal() ? "let external " : (v->isConstant() ? "let " : "var "))
                        << getTypeDescription (type.type) << ' ';

                    printVarWithPrefix (v->name);

                    if (v->initialValue != nullptr)
                    {
                        out << " = ";
                        printExpression (*v->initialValue);
                    }

                    printDescription (v->annotation);
                    out << ';' << newLine;
                }
            }
        }